

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2019::DataTransform<long_double,_signed_char>::DataTransform
          (DataTransform<long_double,_signed_char> *this,string *print_format,int num_column,
          NumericType input_numeric_type,WarningType warning_type,bool rounding,bool is_ascii_input,
          bool is_ascii_output,char minimum_value,char maximum_value)

{
  (this->super_DataTransformInterface)._vptr_DataTransformInterface =
       (_func_int **)&PTR__DataTransform_001559b8;
  std::__cxx11::string::string((string *)&this->print_format_,(string *)print_format);
  this->num_column_ = num_column;
  this->input_numeric_type_ = input_numeric_type;
  this->warning_type_ = warning_type;
  this->rounding_ = rounding;
  this->is_ascii_input_ = is_ascii_input;
  this->is_ascii_output_ = is_ascii_output;
  this->minimum_value_ = minimum_value;
  this->maximum_value_ = maximum_value;
  return;
}

Assistant:

DataTransform(const std::string& print_format, int num_column,
                NumericType input_numeric_type, WarningType warning_type,
                bool rounding, bool is_ascii_input, bool is_ascii_output,
                T2 minimum_value = static_cast<T2>(0),
                T2 maximum_value = static_cast<T2>(0))
      : print_format_(print_format),
        num_column_(num_column),
        input_numeric_type_(input_numeric_type),
        warning_type_(warning_type),
        rounding_(rounding),
        is_ascii_input_(is_ascii_input),
        is_ascii_output_(is_ascii_output),
        minimum_value_(minimum_value),
        maximum_value_(maximum_value) {
  }